

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

char * getalias(char *name)

{
  ident *this;
  char *pcVar1;
  char *local_8;
  
  this = hashset<ident>::access<char_const*>(&idents,&local_8);
  pcVar1 = "";
  if (((this != (ident *)0x0) && (this->type == 4)) &&
     ((0x18 < this->index || (((uint)aliasstack->usedargs >> (this->index & 0x1fU) & 1) != 0)))) {
    pcVar1 = ident::getstr(this);
  }
  return pcVar1;
}

Assistant:

const char *getalias(const char *name)
{
    ident *i = idents.access(name);
    return i && i->type==ID_ALIAS && (i->index >= MAXARGS || aliasstack->usedargs&(1<<i->index)) ? i->getstr() : "";
}